

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  char cVar1;
  bool bVar2;
  undefined8 __nptr;
  int iVar3;
  int iVar4;
  long lVar5;
  char **ppcVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  int *piVar11;
  anon_union_8_4_dbbb708a_for_data *paVar12;
  anon_union_8_4_dbbb708a_for_data aVar13;
  uint *puVar14;
  byte bVar15;
  va_stack_t *pvVar16;
  uint uVar17;
  size_t maxlength;
  int iVar18;
  long lVar19;
  byte *buffer;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  bool bVar25;
  ulong uStack_15b0;
  long local_1598;
  long local_1588;
  char *local_1580;
  char *local_1578;
  char *local_1568;
  char *local_1560;
  char formatbuf [32];
  char work [256];
  va_stack_t vto [128];
  char *endpos [128];
  
  work._0_8_ = format;
  iVar18 = 0;
  ppcVar6 = endpos;
  pcVar20 = (char *)0;
LAB_0011ba35:
  pcVar24 = (char *)(work._0_8_ + 1);
  do {
    pcVar9 = pcVar24;
    if (pcVar9[-1] == '\0') {
      lVar7 = 0;
      if (0 < (long)pcVar20) {
        lVar7 = (long)pcVar20;
      }
      pvVar16 = vto;
      lVar5 = 1;
      goto LAB_0011bf56;
    }
    if (pcVar9[-1] != '%') {
      work._0_8_ = pcVar9;
      goto LAB_0011ba35;
    }
    pcVar24 = pcVar9 + 2;
  } while (*pcVar9 == '%');
  iVar18 = iVar18 + 1;
  work._0_8_ = pcVar9;
  lVar5 = dprintf_DollarString(pcVar9,(char **)work);
  lVar7 = (long)iVar18;
  if (lVar5 != 0) {
    lVar7 = lVar5;
  }
  if ((long)pcVar20 < lVar7) {
    pcVar20 = (char *)lVar7;
  }
  lVar5 = 0;
  local_1598 = 0;
  uVar17 = 0;
  local_1560 = pcVar20;
  do {
    __nptr = work._0_8_;
    bVar15 = *(byte *)work._0_8_;
    uVar10 = bVar15 - 0x20;
    if (((0x2f < uVar10) || ((0x900003ff6c09U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
       ((0x12 < bVar15 - 0x68 || ((0x40211U >> (bVar15 - 0x68 & 0x1f) & 1) == 0))))
    goto LAB_0011bc58;
    work._0_8_ = work._0_8_ + 1;
    switch((ulong)uVar10) {
    case 0:
      uVar17 = uVar17 | 1;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xf:
      break;
    case 3:
      uVar17 = uVar17 | 8;
      break;
    case 10:
      uVar17 = uVar17 | 0x4000;
      iVar18 = iVar18 + 1;
      lVar19 = dprintf_DollarString((char *)work._0_8_,(char **)work);
      lVar5 = (long)iVar18;
      if (lVar19 != 0) {
        lVar5 = lVar19;
      }
      if ((long)local_1560 < lVar5) {
        local_1560 = (char *)lVar5;
      }
      break;
    case 0xb:
      uVar17 = uVar17 | 2;
      break;
    case 0xd:
      uVar17 = uVar17 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*(char *)work._0_8_ == '*') {
        uVar17 = uVar17 | 0x18000;
        work._0_8_ = __nptr + 2;
        iVar18 = iVar18 + 1;
        lVar19 = dprintf_DollarString((char *)work._0_8_,(char **)work);
        local_1598 = (long)iVar18;
        if (lVar19 != 0) {
          local_1598 = lVar19;
        }
        if ((long)local_1560 < local_1598) {
          local_1560 = (char *)local_1598;
        }
      }
      else {
        uVar17 = uVar17 | 0x8000;
        local_1598 = strtol((char *)work._0_8_,(char **)work,10);
      }
      break;
    case 0x10:
      uVar17 = uVar17 | (~uVar17 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar17 = uVar17 | 0x2000;
      lVar5 = strtol((char *)__nptr,(char **)work,10);
      break;
    default:
      if (bVar15 != 0x4c) {
        if (bVar15 != 0x4f) {
          if (bVar15 == 0x68) {
            uVar17 = uVar17 | 0x10;
            break;
          }
          if (bVar15 == 0x6c) {
            if ((uVar17 & 0x20) != 0) goto LAB_0011bc19;
          }
          else {
            if (bVar15 == 0x71) {
LAB_0011bc19:
              uVar17 = uVar17 | 0x40;
              break;
            }
            if (bVar15 != 0x7a) break;
          }
        }
        uVar17 = uVar17 | 0x20;
        break;
      }
      uVar17 = uVar17 | 0x80;
    }
  } while( true );
LAB_0011bf56:
  if (lVar5 - lVar7 == 1) goto LAB_0011c0c9;
  if ((lVar5 < (long)pcVar20) && (pvVar16[1].type == FORMAT_WIDTH)) {
    uVar17 = ap_save->gp_offset;
    if ((ulong)uVar17 < 0x29) {
      piVar11 = (int *)((ulong)uVar17 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar17 + 8;
    }
    else {
      piVar11 = (int *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = piVar11 + 2;
    }
    pvVar16[1].data = (anon_union_8_4_dbbb708a_for_data)(long)*piVar11;
  }
  switch(pvVar16->type) {
  case FORMAT_UNKNOWN:
  case FORMAT_STRING:
  case FORMAT_PTR:
  case FORMAT_INTPTR:
switchD_0011bfac_caseD_0:
    uVar17 = ap_save->gp_offset;
    if ((ulong)uVar17 < 0x29) {
      paVar12 = (anon_union_8_4_dbbb708a_for_data *)((ulong)uVar17 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar17 + 8;
    }
    else {
      paVar12 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar12 + 1;
    }
    aVar13 = *paVar12;
    goto LAB_0011bfd6;
  case FORMAT_INT:
    uVar17 = pvVar16->flags;
    if ((((~uVar17 & 0x240) == 0) || ((uVar17 & 0x40) != 0)) || ((~uVar17 & 0x220) == 0))
    goto switchD_0011bfac_caseD_0;
    uVar10 = ap_save->gp_offset;
    uVar22 = (ulong)uVar10;
    if ((uVar17 & 0x20) == 0) {
      if ((uVar17 >> 9 & 1) == 0) {
        if (uVar10 < 0x29) {
          piVar11 = (int *)(uVar22 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar10 + 8;
        }
        else {
          piVar11 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar11 + 2;
        }
        aVar13 = (anon_union_8_4_dbbb708a_for_data)(long)*piVar11;
      }
      else {
        if (uVar10 < 0x29) {
          puVar14 = (uint *)(uVar22 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar10 + 8;
        }
        else {
          puVar14 = (uint *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = puVar14 + 2;
        }
        aVar13._4_4_ = 0;
        aVar13._0_4_ = *puVar14;
      }
    }
    else {
      if (uVar10 < 0x29) {
        paVar12 = (anon_union_8_4_dbbb708a_for_data *)(uVar22 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar10 + 8;
      }
      else {
        paVar12 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = paVar12 + 1;
      }
      aVar13 = *paVar12;
    }
LAB_0011bfd6:
    pvVar16->data = aVar13;
    break;
  case FORMAT_DOUBLE:
    uVar17 = ap_save->fp_offset;
    if ((ulong)uVar17 < 0xa1) {
      paVar12 = (anon_union_8_4_dbbb708a_for_data *)((ulong)uVar17 + (long)ap_save->reg_save_area);
      ap_save->fp_offset = uVar17 + 0x10;
    }
    else {
      paVar12 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar12 + 1;
    }
    pvVar16->data = *paVar12;
    break;
  case FORMAT_WIDTH:
    pvVar16->type = FORMAT_INT;
  }
  pvVar16 = pvVar16 + 1;
  lVar5 = lVar5 + 1;
  goto LAB_0011bf56;
LAB_0011c0c9:
  ppcVar6 = endpos;
  local_1588 = 0;
  iVar18 = 0;
  local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
  do {
    pcVar20 = format;
    while( true ) {
      while (local_1568 = pcVar20, cVar1 = *format, cVar1 != '%') {
        if (cVar1 == '\0') {
          return iVar18;
        }
        do {
          iVar3 = (*stream)((int)cVar1,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
          cVar1 = format[1];
          format = format + 1;
          pcVar20 = format;
        } while ((cVar1 != '\0') && (pcVar20 = format, cVar1 != '%'));
      }
      local_1568 = format + 1;
      if (format[1] != '%') break;
      format = format + 2;
      local_1568 = format;
      iVar3 = (*stream)(0x25,(FILE *)data);
      if (iVar3 == -1) {
        return iVar18;
      }
      iVar18 = iVar18 + 1;
      pcVar20 = local_1568;
    }
    lVar5 = dprintf_DollarString(local_1568,&local_1568);
    lVar7 = lVar5 + -1;
    if (lVar5 == 0) {
      lVar7 = local_1588;
    }
    paVar12 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar7].width;
    uVar17 = vto[lVar7].flags;
    if ((uVar17 >> 0xe & 1) != 0) {
      paVar12 = &vto[(long)paVar12->str].data;
    }
    pcVar20 = paVar12->str;
    if ((uVar17 >> 0x10 & 1) == 0) {
      local_1588 = local_1588 + 1;
      if ((short)uVar17 < 0) {
        local_1580 = (char *)vto[lVar7].precision;
      }
      else {
        local_1580 = (char *)0xffffffffffffffff;
      }
    }
    else {
      local_1580 = vto[vto[lVar7].precision].data.str;
      local_1588 = local_1588 + 2;
    }
    switch(vto[lVar7].type) {
    case FORMAT_STRING:
      local_1578 = vto[lVar7].data.str;
      if (local_1578 == (char *)0x0) {
        if (local_1580 == (char *)0xffffffffffffffff || 4 < (long)local_1580) {
          uVar17 = uVar17 & 0xfffffff7;
          vto[lVar7].flags = uVar17;
          local_1578 = "(nil)";
          local_1580 = (char *)0x5;
        }
        else {
          local_1578 = "";
          local_1580 = (char *)0x0;
        }
      }
      else if (local_1580 == (char *)0xffffffffffffffff) {
        local_1580 = (char *)strlen(local_1578);
      }
      if ((uVar17 & 8) != 0) {
        iVar3 = (*stream)(0x22,(FILE *)data);
        if (iVar3 == -1) {
          return iVar18;
        }
        iVar18 = iVar18 + 1;
        uVar17 = vto[lVar7].flags;
      }
      uVar21 = (long)pcVar20 - (long)local_1580;
      uVar22 = uVar21;
      if ((uVar17 & 4) == 0) {
        uVar22 = ((long)uVar21 >> 0x3f & uVar21) - 1;
        for (; 0 < (long)uVar21; uVar21 = uVar21 - 1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
        }
      }
      for (pcVar20 = (char *)0x0; iVar3 = (int)local_1580, local_1580 != pcVar20;
          pcVar20 = pcVar20 + 1) {
        iVar3 = (int)pcVar20;
        if (local_1578[(long)pcVar20] == '\0') break;
        iVar3 = (*stream)((int)local_1578[(long)pcVar20],(FILE *)data);
        if (iVar3 == -1) {
          return iVar18 + (int)pcVar20;
        }
      }
      iVar18 = iVar18 + iVar3;
      uVar17 = vto[lVar7].flags;
      if ((uVar17 & 4) != 0) {
        for (; 0 < (long)uVar22; uVar22 = uVar22 - 1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
        }
        uVar17 = vto[lVar7].flags;
      }
      if ((uVar17 & 8) != 0) {
        iVar3 = (*stream)(0x22,(FILE *)data);
        if (iVar3 == -1) {
          return iVar18;
        }
        iVar18 = iVar18 + 1;
      }
      break;
    case FORMAT_PTR:
      pcVar24 = vto[lVar7].data.str;
      if (pcVar24 != (char *)0x0) {
        local_1560 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar17 >> 0xc & 1) == 0) {
          local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar10 = 1;
LAB_0011c2e5:
        bVar2 = false;
        bVar15 = 1;
        uStack_15b0 = 0x10;
        pcVar9 = pcVar24;
        goto LAB_0011c565;
      }
      pcVar20 = pcVar20 + -5;
      pcVar24 = pcVar20;
      if ((uVar17 & 4) != 0) {
        uVar22 = (long)pcVar20 >> 0x3f & (ulong)pcVar20;
        for (; pcVar24 = (char *)(uVar22 - 1), 0 < (long)pcVar20; pcVar20 = pcVar20 + -1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
        }
      }
      iVar3 = iVar18 + 5;
      for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
        iVar4 = (*stream)((int)"(nil)"[lVar5],(FILE *)data);
        if (iVar4 == -1) {
          return iVar18 + (int)lVar5;
        }
      }
      iVar18 = iVar3;
      if ((vto[lVar7].flags & 4) == 0) {
        for (; 0 < (long)pcVar24; pcVar24 = pcVar24 + -1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
        }
        goto switchD_0011c213_caseD_5;
      }
      break;
    case FORMAT_INT:
      pcVar24 = vto[lVar7].data.str;
      if ((uVar17 >> 0x11 & 1) == 0) {
        uVar10 = uVar17 >> 3 & 1;
        pcVar9 = pcVar24;
        if ((uVar17 >> 10 & 1) == 0) {
          if ((uVar17 >> 0xb & 1) != 0) {
            local_1560 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((uVar17 >> 0xc & 1) == 0) {
              local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            goto LAB_0011c2e5;
          }
          if ((uVar17 >> 9 & 1) != 0) {
            bVar2 = false;
            bVar15 = 0;
            uStack_15b0 = 10;
            goto LAB_0011c565;
          }
          pcVar9 = (char *)-(long)pcVar24;
          if (0 < (long)pcVar24) {
            pcVar9 = pcVar24;
          }
          bVar25 = -1 < (long)pcVar24;
          bVar2 = false;
          bVar15 = 0;
          uStack_15b0 = 10;
        }
        else {
          bVar15 = 0;
          bVar2 = true;
          uStack_15b0 = 8;
LAB_0011c565:
          bVar25 = true;
        }
        lVar5 = 0;
        for (; pcVar9 != (char *)0x0; pcVar9 = (char *)((ulong)pcVar9 / uStack_15b0)) {
          work[lVar5 + 0xff] = local_1560[(ulong)pcVar9 % uStack_15b0];
          lVar5 = lVar5 + -1;
        }
        if (local_1580 == (char *)0xffffffffffffffff) {
          local_1580 = (char *)0x1;
        }
        local_1580 = local_1580 + lVar5;
        if ((bVar2 && uVar10 != 0) && ((long)local_1580 < 1)) {
          work[lVar5 + 0xff] = '0';
          pcVar20 = pcVar20 + lVar5 + -1;
          lVar5 = lVar5 + 0xfe;
        }
        else {
          pcVar20 = pcVar20 + lVar5;
          lVar5 = lVar5 + 0xff;
          pcVar24 = local_1580;
          if (0 < (long)local_1580) {
            for (; 0 < (long)pcVar24; pcVar24 = pcVar24 + -1) {
              work[lVar5] = '0';
              lVar5 = lVar5 + -1;
            }
            pcVar20 = pcVar20 + -(long)local_1580;
          }
        }
        bVar15 = (byte)uVar10 & bVar15;
        pcVar24 = pcVar20 + -2;
        if (bVar15 == 0) {
          pcVar24 = pcVar20;
        }
        uVar21 = (long)pcVar24 - (ulong)(byte)(bVar25 ^ 1U | (uVar17 & 3) != 0);
        uVar22 = uVar21;
        if ((uVar17 & 0x104) == 0) {
          uVar22 = ((long)uVar21 >> 0x3f & uVar21) - 1;
          for (; 0 < (long)uVar21; uVar21 = uVar21 - 1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar18;
            }
            iVar18 = iVar18 + 1;
          }
        }
        if (bVar25 == false) {
          uStack_15b0._0_4_ = 0x2d;
LAB_0011c694:
          iVar3 = (*stream)((int)uStack_15b0,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
        }
        else {
          if ((vto[lVar7].flags & 2U) != 0) {
            uStack_15b0._0_4_ = 0x2b;
            goto LAB_0011c694;
          }
          if ((vto[lVar7].flags & 1U) != 0) {
            uStack_15b0._0_4_ = 0x20;
            goto LAB_0011c694;
          }
        }
        if (bVar15 != 0) {
          iVar3 = (*stream)(0x30,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          if ((vto[lVar7].flags & 0x1000) == 0) {
            uStack_15b0._0_4_ = 0x78;
          }
          else {
            uStack_15b0._0_4_ = 0x58;
          }
          iVar3 = (*stream)((int)uStack_15b0,(FILE *)data);
          if (iVar3 == -1) {
            return iVar18 + 1;
          }
          iVar18 = iVar18 + 2;
        }
        uVar21 = uVar22;
        if ((vto[lVar7].flags & 0x104U) == 0x100) {
          uVar23 = (long)uVar22 >> 0x3f & uVar22;
          for (; uVar21 = uVar23 - 1, 0 < (long)uVar22; uVar22 = uVar22 - 1) {
            iVar3 = (*stream)(0x30,(FILE *)data);
            if (iVar3 == -1) {
              return iVar18;
            }
            iVar18 = iVar18 + 1;
          }
        }
        for (; lVar5 < 0xff; lVar5 = lVar5 + 1) {
          iVar3 = (*stream)((int)work[lVar5 + 1],(FILE *)data);
          if (iVar3 == -1) {
            return iVar18;
          }
          iVar18 = iVar18 + 1;
        }
        if ((vto[lVar7].flags & 4) != 0) {
          for (; 0 < (long)uVar21; uVar21 = uVar21 - 1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar18;
            }
            iVar18 = iVar18 + 1;
          }
        }
      }
      else {
        if ((uVar17 & 4) == 0) {
          for (; 1 < (long)pcVar20; pcVar20 = pcVar20 + -1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar18;
            }
            iVar18 = iVar18 + 1;
          }
          pcVar20 = pcVar20 + -1;
        }
        iVar3 = (*stream)((uint)pcVar24 & 0xff,(FILE *)data);
        if (iVar3 == -1) {
          return iVar18;
        }
        iVar18 = iVar18 + 1;
        if ((vto[lVar7].flags & 4) != 0) {
          for (; 1 < (long)pcVar20; pcVar20 = pcVar20 + -1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar18;
            }
            iVar18 = iVar18 + 1;
          }
          goto switchD_0011c213_caseD_5;
        }
      }
      break;
    case FORMAT_INTPTR:
      if ((uVar17 & 0x40) != 0) {
        *(long *)vto[lVar7].data.str = (long)iVar18;
        goto switchD_0011c213_caseD_5;
      }
      if ((uVar17 & 0x20) == 0) {
        if ((uVar17 & 0x10) == 0) {
          *(int *)vto[lVar7].data.str = iVar18;
        }
        else {
          *(short *)vto[lVar7].data.str = (short)iVar18;
        }
      }
      else {
        *(long *)vto[lVar7].data.str = (long)iVar18;
      }
      break;
    default:
switchD_0011c213_caseD_5:
      break;
    case FORMAT_DOUBLE:
      formatbuf[0x10] = '\0';
      formatbuf[0x11] = '\0';
      formatbuf[0x12] = '\0';
      formatbuf[0x13] = '\0';
      formatbuf[0x14] = '\0';
      formatbuf[0x15] = '\0';
      formatbuf[0x16] = '\0';
      formatbuf[0x17] = '\0';
      formatbuf[0x18] = '\0';
      formatbuf[0x19] = '\0';
      formatbuf[0x1a] = '\0';
      formatbuf[0x1b] = '\0';
      formatbuf[0x1c] = '\0';
      formatbuf[0x1d] = '\0';
      formatbuf[0x1e] = '\0';
      formatbuf[0x1f] = '\0';
      formatbuf[0] = '%';
      formatbuf[1] = '\0';
      formatbuf[2] = '\0';
      formatbuf[3] = '\0';
      formatbuf[4] = '\0';
      formatbuf[5] = '\0';
      formatbuf[6] = '\0';
      formatbuf[7] = '\0';
      formatbuf[8] = '\0';
      formatbuf[9] = '\0';
      formatbuf[10] = '\0';
      formatbuf[0xb] = '\0';
      formatbuf[0xc] = '\0';
      formatbuf[0xd] = '\0';
      formatbuf[0xe] = '\0';
      formatbuf[0xf] = '\0';
      sVar8 = strlen(formatbuf);
      if ((uVar17 >> 0xd & 1) == 0) {
        pcVar20 = (char *)0xffffffffffffffff;
        if ((uVar17 >> 0xe & 1) != 0) {
          paVar12 = &vto[vto[lVar7].width].data;
          goto LAB_0011c3ba;
        }
      }
      else {
        paVar12 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar7].width;
LAB_0011c3ba:
        pcVar20 = paVar12->str;
      }
      if ((short)uVar17 < 0) {
        paVar12 = (anon_union_8_4_dbbb708a_for_data *)&vto[lVar7].precision;
LAB_0011c3e4:
        pcVar24 = paVar12->str;
      }
      else {
        pcVar24 = (char *)0xffffffffffffffff;
        if ((uVar17 >> 0x10 & 1) != 0) {
          paVar12 = &vto[vto[lVar7].precision].data;
          goto LAB_0011c3e4;
        }
      }
      buffer = (byte *)(formatbuf + 1);
      if ((uVar17 & 4) != 0) {
        formatbuf[1] = '-';
        buffer = (byte *)(formatbuf + 2);
      }
      if ((uVar17 & 2) != 0) {
        *buffer = 0x2b;
        buffer = buffer + 1;
      }
      if ((uVar17 & 1) != 0) {
        *buffer = 0x20;
        buffer = buffer + 1;
        uVar17 = vto[lVar7].flags;
      }
      if ((uVar17 & 8) != 0) {
        *buffer = 0x23;
        buffer = buffer + 1;
      }
      maxlength = 0x20 - sVar8;
      *buffer = 0;
      if (-1 < (long)pcVar20) {
        iVar3 = curl_msnprintf((char *)buffer,maxlength,"%ld");
        buffer = buffer + iVar3;
        maxlength = maxlength - (long)iVar3;
      }
      if (-1 < (long)pcVar24) {
        iVar3 = curl_msnprintf((char *)buffer,maxlength,".%ld",pcVar24);
        buffer = buffer + iVar3;
      }
      uVar17 = vto[lVar7].flags;
      if ((uVar17 & 0x20) != 0) {
        *buffer = 0x6c;
        buffer = buffer + 1;
        uVar17 = vto[lVar7].flags;
      }
      if ((uVar17 >> 0x12 & 1) == 0) {
        bVar15 = 0x66;
        if ((uVar17 >> 0x13 & 1) != 0) {
          bVar15 = ((uVar17 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar15 = ((uVar17 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *buffer = bVar15;
      buffer[1] = 0;
      pcVar20 = work;
      sprintf(pcVar20,formatbuf,SUB84(vto[lVar7].data,0));
      for (; *pcVar20 != '\0'; pcVar20 = pcVar20 + 1) {
        iVar3 = (*stream)((int)*pcVar20,(FILE *)data);
        if (iVar3 == -1) {
          return iVar18;
        }
        iVar18 = iVar18 + 1;
      }
    }
    format = *ppcVar6;
    ppcVar6 = ppcVar6 + 1;
  } while( true );
LAB_0011bc58:
  lVar7 = lVar7 + -1;
  switch(bVar15) {
  case 99:
    vto[lVar7].type = FORMAT_INT;
    uVar17 = uVar17 | 0x20000;
    break;
  case 100:
  case 0x69:
    vto[lVar7].type = FORMAT_INT;
    break;
  case 0x65:
    vto[lVar7].type = FORMAT_DOUBLE;
    uVar17 = uVar17 | 0x40000;
    break;
  case 0x66:
    vto[lVar7].type = FORMAT_DOUBLE;
    break;
  case 0x67:
    vto[lVar7].type = FORMAT_DOUBLE;
    uVar17 = uVar17 | 0x80000;
    break;
  case 0x6e:
    vto[lVar7].type = FORMAT_INTPTR;
    break;
  case 0x6f:
    vto[lVar7].type = FORMAT_INT;
    uVar17 = uVar17 | 0x400;
    break;
  case 0x70:
    vto[lVar7].type = FORMAT_PTR;
    break;
  case 0x73:
switchD_0011bc85_caseD_73:
    vto[lVar7].type = FORMAT_STRING;
    break;
  case 0x75:
    vto[lVar7].type = FORMAT_INT;
    uVar17 = uVar17 | 0x200;
    break;
  case 0x78:
    vto[lVar7].type = FORMAT_INT;
    uVar17 = uVar17 | 0xa00;
    break;
  default:
    if (bVar15 == 0x45) {
      vto[lVar7].type = FORMAT_DOUBLE;
      uVar17 = uVar17 | 0x41000;
      break;
    }
    if (bVar15 == 0x47) {
      vto[lVar7].type = FORMAT_DOUBLE;
      uVar17 = uVar17 | 0x81000;
      break;
    }
    if (bVar15 == 0x58) {
      vto[lVar7].type = FORMAT_INT;
      uVar17 = uVar17 | 0x1a00;
      break;
    }
    if (bVar15 == 0x53) {
      uVar17 = uVar17 | 8;
      goto switchD_0011bc85_caseD_73;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    vto[lVar7].type = FORMAT_UNKNOWN;
  }
  vto[lVar7].flags = uVar17;
  vto[lVar7].width = lVar5;
  vto[lVar7].precision = local_1598;
  lVar19 = lVar7;
  if ((uVar17 >> 0xe & 1) != 0) {
    lVar19 = lVar5 + -1;
    vto[lVar7].width = lVar19;
    vto[lVar19].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[lVar19].flags = 0;
    *(undefined8 *)((long)&vto[lVar19].width + 4) = 0;
    *(undefined4 *)((long)&vto[lVar19].precision + 4) = 0;
  }
  if ((uVar17 >> 0x10 & 1) != 0) {
    local_1598 = local_1598 + -1;
    vto[lVar19].precision = local_1598;
    vto[local_1598].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[local_1598].flags = 0;
    *(undefined8 *)((long)&vto[local_1598].width + 4) = 0;
    *(undefined4 *)((long)&vto[local_1598].precision + 4) = 0;
  }
  *ppcVar6 = (char *)(work._0_8_ + 1);
  ppcVar6 = ppcVar6 + 1;
  pcVar20 = local_1560;
  goto LAB_0011ba35;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while((len-- > 0) && *str)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}